

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

StructBuilder * __thiscall
capnp::_::PointerBuilder::getStruct
          (StructBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize size,
          word *defaultValue)

{
  ushort uVar1;
  uint uVar2;
  word *pwVar3;
  AllocateResult AVar4;
  AllocateResult AVar5;
  StructSize SVar6;
  WirePointer *pWVar7;
  SegmentBuilder *pSVar8;
  SegmentBuilder *pSVar9;
  ushort uVar10;
  undefined8 *puVar11;
  int iVar12;
  ushort uVar13;
  WirePointer *pWVar14;
  word *result;
  ulong uVar15;
  WirePointer *__dest;
  uint uVar16;
  uint uVar17;
  WirePointer *pWVar18;
  ulong uVar19;
  AllocateResult AVar20;
  AllocateResult AVar21;
  ushort local_98;
  WirePointer *local_90;
  SegmentBuilder *local_88;
  WirePointer *local_80;
  undefined8 local_78;
  CapTableBuilder *local_70;
  StructBuilder *local_68;
  ulong local_60;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  local_90 = this->pointer;
  local_88 = this->segment;
  local_70 = this->capTable;
  uVar17 = (local_90->offsetAndKind).value;
  uVar10 = size.pointers;
  local_98 = size.data;
  local_68 = __return_storage_ptr__;
  if ((local_90->field_1).upper32Bits == 0 && uVar17 == 0) goto LAB_00154fa5;
  pWVar7 = local_90 + (long)((int)uVar17 >> 2) + 1;
  while( true ) {
    pWVar18 = local_90;
    pSVar8 = local_88;
    if ((uVar17 & 3) == 2) {
      pSVar8 = BuilderArena::getSegment
                         ((BuilderArena *)(local_88->super_SegmentReader).arena,
                          (SegmentId)(local_90->field_1).structRef);
      uVar17 = (pWVar18->offsetAndKind).value;
      pwVar3 = (pSVar8->super_SegmentReader).ptr.ptr;
      uVar19 = (ulong)(uVar17 & 0xfffffff8);
      pWVar14 = (WirePointer *)((long)&pwVar3->content + uVar19);
      pWVar18 = (WirePointer *)((long)&pwVar3[1].content + uVar19);
      if ((uVar17 & 4) == 0) {
        pWVar7 = pWVar18 + ((int)(pWVar14->offsetAndKind).value >> 2);
        pWVar18 = pWVar14;
      }
      else {
        pSVar8 = BuilderArena::getSegment
                           ((BuilderArena *)(pSVar8->super_SegmentReader).arena,
                            (SegmentId)(pWVar14->field_1).structRef);
        pWVar7 = (WirePointer *)
                 ((long)&((pSVar8->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar14->offsetAndKind).value & 0xfffffff8));
      }
    }
    pWVar14 = local_90;
    if (pSVar8->readOnly == true) {
      SegmentBuilder::throwNotWritable(pSVar8);
    }
    _kjCondition.left = (pWVar18->offsetAndKind).value & OTHER;
    _kjCondition.result = _kjCondition.left == STRUCT;
    _kjCondition.right = STRUCT;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) break;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[88]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x47b,FAILED,"oldRef->kind() == WirePointer::STRUCT",
               "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer was expected.\""
               ,&_kjCondition,
               (char (*) [88])
               "Schema mismatch: Message contains non-struct pointer where struct pointer was expected."
              );
    kj::_::Debug::Fault::~Fault(&f);
LAB_00154fa5:
    pSVar8 = local_88;
    __dest = local_90;
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      AVar4.words = (word *)local_90;
      AVar4.segment = local_88;
      AVar20.words = (word *)local_90;
      AVar20.segment = local_88;
      SVar6 = (StructSize)((uint)size & 0xffff);
      uVar17 = ((uint)size >> 0x10) + ((uint)size & 0xffff);
      if ((local_90->field_1).upper32Bits != 0 || (local_90->offsetAndKind).value != 0) {
        WireHelpers::zeroObject(local_88,local_70,local_90);
      }
      if (uVar17 == 0) {
        (__dest->offsetAndKind).value = 0xfffffffc;
      }
      else {
        pWVar7 = (WirePointer *)pSVar8->pos;
        if (((long)((long)(pSVar8->super_SegmentReader).ptr.ptr +
                   ((pSVar8->super_SegmentReader).ptr.size_ * 8 - (long)pWVar7)) >> 3 <
             (long)(ulong)uVar17) ||
           (pSVar8->pos = (word *)(pWVar7 + uVar17), pWVar7 == (WirePointer *)0x0)) {
          AVar20 = BuilderArena::allocate
                             ((BuilderArena *)(pSVar8->super_SegmentReader).arena,uVar17 + 1);
          (__dest->offsetAndKind).value =
               (int)AVar20.words - *(int *)&((AVar20.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          __dest->field_1 =
               (anon_union_4_5_35ddcec3_for_WirePointer_1)
               ((AVar20.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar20.words)->content = 0;
          __dest = (WirePointer *)(AVar20.words + 1);
        }
        else {
          (__dest->offsetAndKind).value =
               ((uint)((ulong)((long)pWVar7 - (long)__dest) >> 1) & 0xfffffffc) - 4;
          __dest = pWVar7;
          AVar20 = AVar4;
        }
      }
      pSVar8 = AVar20.segment;
      *(ushort *)((long)&(AVar20.words)->content + 4) = local_98;
      *(ushort *)((long)&(AVar20.words)->content + 6) = uVar10;
      pWVar18 = __dest + ((uint)size & 0xffff);
      uVar13 = uVar10;
LAB_0015521a:
      local_68->segment = pSVar8;
      local_68->capTable = local_70;
      local_68->data = __dest;
      local_68->pointers = pWVar18;
      local_68->dataSize = (int)SVar6 << 6;
      local_68->pointerCount = uVar13;
      return local_68;
    }
    pWVar7 = (WirePointer *)
             WireHelpers::copyMessage(&local_88,local_70,&local_90,(WirePointer *)defaultValue);
    uVar17 = (local_90->offsetAndKind).value;
    defaultValue = (word *)0x0;
  }
  uVar1 = *(ushort *)&pWVar18->field_1;
  uVar15 = (ulong)uVar1;
  uVar13 = *(ushort *)((long)&pWVar18->field_1 + 2);
  uVar19 = (ulong)uVar13;
  pWVar18 = pWVar7 + uVar15;
  SVar6.pointers = 0;
  SVar6.data = uVar1;
  __dest = pWVar7;
  if (uVar13 < uVar10 || uVar1 < local_98) {
    if (uVar1 <= local_98) {
      SVar6 = size;
    }
    uVar17 = (uint)size >> 0x10;
    if (uVar10 < uVar13) {
      uVar17 = (uint)uVar13;
    }
    local_80 = (WirePointer *)CONCAT44(local_80._4_4_,SVar6);
    SVar6 = (StructSize)((uint)SVar6 & 0xffff);
    uVar16 = uVar17;
    if (((local_90->offsetAndKind).value & 3) == 2) {
      local_78 = CONCAT44(local_78._4_4_,uVar17);
      pSVar9 = BuilderArena::getSegment
                         ((BuilderArena *)(local_88->super_SegmentReader).arena,
                          (SegmentId)(local_90->field_1).structRef);
      uVar16 = (uint)local_78;
      if (pSVar9->readOnly == false) {
        uVar2 = (pWVar14->offsetAndKind).value;
        puVar11 = (undefined8 *)
                  ((long)&((pSVar9->super_SegmentReader).ptr.ptr)->content +
                  (ulong)(uVar2 & 0xfffffff8));
        if ((uVar2 & 4) == 0) {
          *puVar11 = 0;
        }
        else {
          *puVar11 = 0;
          puVar11[1] = 0;
        }
      }
    }
    uVar16 = uVar16 + (int)SVar6;
    pWVar14->offsetAndKind = 0;
    pWVar14->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    if ((local_90->field_1).upper32Bits != 0 || (local_90->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(local_88,local_70,local_90);
    }
    pWVar14 = local_80;
    AVar21.words = (word *)local_90;
    AVar21.segment = local_88;
    AVar5.words = (word *)local_90;
    AVar5.segment = local_88;
    uVar2 = (uint)local_80;
    local_78 = uVar15;
    if (uVar16 == 0) {
      (local_90->offsetAndKind).value = 0xfffffffc;
      __dest = local_90;
    }
    else {
      __dest = (WirePointer *)local_88->pos;
      if (((long)((long)(local_88->super_SegmentReader).ptr.ptr +
                 ((local_88->super_SegmentReader).ptr.size_ * 8 - (long)__dest)) >> 3 <
           (long)(ulong)uVar16) ||
         (local_88->pos = (word *)(__dest + uVar16), __dest == (WirePointer *)0x0)) {
        AVar21 = BuilderArena::allocate
                           ((BuilderArena *)(local_88->super_SegmentReader).arena,uVar16 + 1);
        (local_90->offsetAndKind).value =
             (int)AVar21.words - *(int *)&((AVar21.segment)->super_SegmentReader).ptr.ptr &
             0xfffffff8U | 2;
        local_90->field_1 =
             (anon_union_4_5_35ddcec3_for_WirePointer_1)
             ((AVar21.segment)->super_SegmentReader).id.value;
        *(undefined4 *)&(AVar21.words)->content = 0;
        __dest = (WirePointer *)(AVar21.words + 1);
      }
      else {
        (local_90->offsetAndKind).value =
             ((uint)((ulong)((long)__dest - (long)local_90) >> 1) & 0xfffffffc) - 4;
        AVar21 = AVar5;
      }
    }
    local_90 = (WirePointer *)AVar21.words;
    local_88 = AVar21.segment;
    (local_90->field_1).structRef.dataSize.value = (unsigned_short)pWVar14;
    uVar10 = (ushort)uVar17;
    (local_90->field_1).structRef.ptrCount.value = uVar10;
    if ((int)local_78 != 0) {
      memcpy(__dest,pWVar7,(ulong)(uint)((int)local_78 << 3));
      AVar21.words = (word *)local_90;
      AVar21.segment = local_88;
    }
    pWVar14 = __dest + (uVar2 & 0xffff);
    local_80 = pWVar14;
    local_60 = uVar19;
    if (uVar13 != 0) {
      do {
        local_90 = (WirePointer *)AVar21.words;
        local_88 = AVar21.segment;
        WireHelpers::transferPointer(local_88,pWVar14,pSVar8,pWVar18);
        AVar21.words = (word *)local_90;
        AVar21.segment = local_88;
        pWVar14 = pWVar14 + 1;
        pWVar18 = pWVar18 + 1;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
    }
    local_90 = (WirePointer *)AVar21.words;
    local_88 = AVar21.segment;
    iVar12 = (int)local_60 + (uint)local_78;
    pWVar18 = local_80;
    pSVar8 = local_88;
    uVar13 = uVar10;
    if (iVar12 != 0) {
      memset(pWVar7,0,(ulong)(uint)(iVar12 * 8));
      pWVar18 = local_80;
      pSVar8 = local_88;
    }
  }
  goto LAB_0015521a;
}

Assistant:

StructBuilder PointerBuilder::getStruct(StructSize size, const word* defaultValue) {
  return WireHelpers::getWritableStructPointer(pointer, segment, capTable, size, defaultValue);
}